

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateEnterExecutingModeIterativeAsync
               (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  Federate *this;
  IterationRequest iterate_00;
  FedObject *pFVar1;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    iterate_00 = (IterationRequest)(0x700030000020100 >> ((char)iterate * '\b' & 0x3fU));
    if (HELICS_ITERATION_REQUEST_ERROR < iterate) {
      iterate_00 = NO_ITERATIONS;
    }
    helics::Federate::enterExecutingModeAsync(this,iterate_00);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingModeIterativeAsync(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterExecutingModeAsync(getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}